

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ping_pong.c
# Opt level: O0

void client_handle_read(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                       cio_read_buffer *read_buffer,size_t num_bytes)

{
  uint8_t *puVar1;
  cio_write_buffer *wbe;
  undefined1 local_b8 [8];
  uint8_t recv_buffer [128];
  client *client;
  size_t num_bytes_local;
  cio_read_buffer *read_buffer_local;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  recv_buffer._120_8_ = handler_context;
  if (err == CIO_EOF) {
    fprintf(_stdout,"connection closed by peer\n");
    cio_buffered_stream_close(buffered_stream);
  }
  else if (err == CIO_SUCCESS) {
    puVar1 = cio_read_buffer_get_read_ptr(read_buffer);
    memcpy(local_b8,puVar1,num_bytes);
    local_b8[num_bytes] = 0;
    fprintf(_stdout,"Client received data: %s , now sending...\n",local_b8);
    *(size_t *)recv_buffer._120_8_ = num_bytes;
    cio_write_buffer_head_init((cio_write_buffer *)(recv_buffer._120_8_ + 0xa8));
    wbe = (cio_write_buffer *)(recv_buffer._120_8_ + 200);
    puVar1 = cio_read_buffer_get_read_ptr(read_buffer);
    cio_write_buffer_element_init(wbe,puVar1,num_bytes);
    cio_write_buffer_queue_tail
              ((cio_write_buffer *)(recv_buffer._120_8_ + 0xa8),
               (cio_write_buffer *)(recv_buffer._120_8_ + 200));
    cio_buffered_stream_write
              (buffered_stream,(cio_write_buffer *)(recv_buffer._120_8_ + 0xa8),client_handle_write,
               (void *)recv_buffer._120_8_);
  }
  else {
    fprintf(_stderr,"read error!\n");
    cio_buffered_stream_close(buffered_stream);
  }
  return;
}

Assistant:

static void client_handle_read(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *read_buffer, size_t num_bytes)
{
	struct client *client = handler_context;

	if (cio_unlikely(err == CIO_EOF)) {
		(void)fprintf(stdout, "connection closed by peer\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "read error!\n");
		cio_buffered_stream_close(buffered_stream);
		return;
	}

	uint8_t recv_buffer[BUFFER_SIZE];
	memcpy(recv_buffer, cio_read_buffer_get_read_ptr(read_buffer), num_bytes);
	recv_buffer[num_bytes] = '\0';
	(void)fprintf(stdout, "Client received data: %s , now sending...\n", recv_buffer);

	client->bytes_read = num_bytes;
	cio_write_buffer_head_init(&client->wbh);
	cio_write_buffer_element_init(&client->wb, cio_read_buffer_get_read_ptr(read_buffer), num_bytes);
	cio_write_buffer_queue_tail(&client->wbh, &client->wb);
	cio_buffered_stream_write(buffered_stream, &client->wbh, client_handle_write, client);
}